

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

int delete_if_not_in_policies(X509_POLICY_NODE *node,void *data)

{
  int iVar1;
  undefined1 local_38 [8];
  POLICYINFO info;
  CERTIFICATEPOLICIES *policies;
  void *data_local;
  X509_POLICY_NODE *node_local;
  
  info.qualifiers = (stack_st_POLICYQUALINFO *)data;
  iVar1 = sk_POLICYINFO_is_sorted((stack_st_POLICYINFO *)data);
  if (iVar1 == 0) {
    __assert_fail("sk_POLICYINFO_is_sorted(policies)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                  ,0xd2,"int delete_if_not_in_policies(X509_POLICY_NODE *, void *)");
  }
  local_38 = (undefined1  [8])node->policy;
  iVar1 = sk_POLICYINFO_find((stack_st_POLICYINFO *)info.qualifiers,(size_t *)0x0,
                             (POLICYINFO *)local_38);
  if (iVar1 == 0) {
    x509_policy_node_free(node);
  }
  node_local._4_4_ = (uint)(iVar1 == 0);
  return node_local._4_4_;
}

Assistant:

static int delete_if_not_in_policies(X509_POLICY_NODE *node, void *data) {
  const CERTIFICATEPOLICIES *policies =
      reinterpret_cast<CERTIFICATEPOLICIES *>(data);
  assert(sk_POLICYINFO_is_sorted(policies));
  POLICYINFO info;
  info.policyid = node->policy;
  if (sk_POLICYINFO_find(policies, NULL, &info)) {
    return 0;
  }
  x509_policy_node_free(node);
  return 1;
}